

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleBase::setupBranchNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,size_t feature_index,
          BranchMode branchMode,double feature_value,size_t trueChildNodeId,size_t falseChildNodeId)

{
  TreeEnsembleParameters_TreeNode *this_00;
  TreeEnsembleParameters_TreeNode *node;
  size_t trueChildNodeId_local;
  double feature_value_local;
  BranchMode branchMode_local;
  size_t feature_index_local;
  size_t nodeId_local;
  size_t treeId_local;
  TreeEnsembleBase *this_local;
  
  this_00 = _getNode(this,treeId,nodeId,true);
  Specification::TreeEnsembleParameters_TreeNode::set_branchfeatureindex(this_00,feature_index);
  Specification::TreeEnsembleParameters_TreeNode::set_nodebehavior(this_00,branchMode);
  Specification::TreeEnsembleParameters_TreeNode::set_branchfeaturevalue(this_00,feature_value);
  Specification::TreeEnsembleParameters_TreeNode::set_truechildnodeid(this_00,trueChildNodeId);
  Specification::TreeEnsembleParameters_TreeNode::set_falsechildnodeid(this_00,falseChildNodeId);
  return;
}

Assistant:

void TreeEnsembleBase::setupBranchNode
    (size_t treeId, size_t nodeId, size_t feature_index,
     BranchMode branchMode,
     double feature_value,
     size_t trueChildNodeId, size_t falseChildNodeId) {

        auto& node = _getNode(treeId, nodeId, true);

        // TODO: Error checking routines -- make sure this node hasn't been requested before.
        node.set_branchfeatureindex(feature_index);
        node.set_nodebehavior(static_cast<Specification::TreeEnsembleParameters::TreeNode::TreeNodeBehavior>(branchMode));
        node.set_branchfeaturevalue(feature_value);
        node.set_truechildnodeid(trueChildNodeId);
        node.set_falsechildnodeid(falseChildNodeId);
    }